

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdVerifyTxSign(void *handle,int net_type,char *tx_hex,char *txid,uint32_t vout,char *address,
                   int address_type,char *direct_locking_script,int64_t value_satoshi,
                   char *value_bytedata)

{
  void *pvVar1;
  bool bVar2;
  AddressType AVar3;
  CfdException *pCVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this;
  _Alloc_hider _Var5;
  initializer_list<cfd::UtxoData> __l;
  bool is_bitcoin;
  ElementsAddressFactory address_factory_1;
  OutPoint outpoint;
  Amount amount;
  AddressFactory address_factory;
  ElementsConfidentialAddress confidential_addr;
  UtxoData utxo;
  bool local_c8a;
  allocator local_c89;
  void *local_c88;
  string local_c80;
  undefined1 local_c60 [16];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_c50;
  OutPoint local_c38;
  Amount local_c10;
  undefined1 local_c00 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bf0 [23];
  undefined1 local_a80 [384];
  pointer local_900;
  pointer local_8f0;
  _Alloc_hider local_8e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8d8 [56];
  UtxoData local_558;
  
  local_c88 = handle;
  cfd::Initialize();
  bVar2 = cfd::capi::IsEmptyString(tx_hex);
  if (bVar2) {
    local_558.block_height = 0x6217ab;
    local_558.block_hash._vptr_BlockHash._0_4_ = 0x8c0;
    local_558.block_hash.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "CfdVerifyTxSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_558,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_558.block_height = (uint64_t)&local_558.block_hash.data_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_558,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_558);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(txid);
  if (bVar2) {
    local_558.block_height = 0x6217ab;
    local_558.block_hash._vptr_BlockHash._0_4_ = 0x8c6;
    local_558.block_hash.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "CfdVerifyTxSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_558,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_558.block_height = (uint64_t)&local_558.block_hash.data_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_558,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_558);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  AVar3 = cfd::capi::ConvertAddressType(0);
  cfd::core::Amount::Amount(&local_c10,value_satoshi);
  std::__cxx11::string::string((string *)local_a80,txid,(allocator *)local_c00);
  cfd::core::Txid::Txid((Txid *)&local_558,(string *)local_a80);
  cfd::core::OutPoint::OutPoint(&local_c38,(Txid *)&local_558,vout);
  local_558.block_height = (uint64_t)&PTR__Txid_0086d9f8;
  pvVar1 = (void *)CONCAT44(local_558.block_hash._vptr_BlockHash._4_4_,
                            local_558.block_hash._vptr_BlockHash._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_558.block_hash.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pvVar1);
  }
  if ((undefined1 *)local_a80._0_8_ != local_a80 + 0x10) {
    operator_delete((void *)local_a80._0_8_,local_a80._16_8_ + 1);
  }
  local_c8a = false;
  cfd::capi::ConvertNetType(net_type,&local_c8a);
  cfd::UtxoData::UtxoData(&local_558);
  local_558.address_type = kP2shAddress;
  local_558.block_height = 0;
  local_558.binary_data = (void *)0x0;
  std::__cxx11::string::_M_replace
            ((ulong)&local_558.descriptor,0,(char *)local_558.descriptor._M_string_length,0x75474e);
  cfd::core::OutPoint::GetTxid((Txid *)local_a80,&local_c38);
  cfd::core::Txid::operator=(&local_558.txid,(Txid *)local_a80);
  local_a80._0_8_ = &PTR__Txid_0086d9f8;
  if ((_func_int **)local_a80._8_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_a80._8_8_,local_a80._24_8_ - local_a80._8_8_);
  }
  local_558.vout = cfd::core::OutPoint::GetVout(&local_c38);
  local_558.amount.amount_ = local_c10.amount_;
  local_558.amount.ignore_check_ = local_c10.ignore_check_;
  local_558.address_type = AVar3;
  bVar2 = cfd::capi::IsEmptyString(address);
  if (bVar2) {
    bVar2 = cfd::capi::IsEmptyString(direct_locking_script);
    if (bVar2) goto LAB_004681b0;
    std::__cxx11::string::string((string *)local_c00,direct_locking_script,(allocator *)local_c60);
    cfd::core::Script::Script((Script *)local_a80,(string *)local_c00);
    cfd::core::Script::operator=(&local_558.locking_script,(Script *)local_a80);
    cfd::core::Script::~Script((Script *)local_a80);
    local_c80.field_2._M_allocated_capacity = local_bf0[0]._M_allocated_capacity;
    _Var5._M_p = (pointer)local_c00._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c00._0_8_ == local_bf0) goto LAB_004681b0;
  }
  else {
    std::__cxx11::string::string((string *)&local_c80,address,(allocator *)local_a80);
    if (local_c8a == true) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_c00);
      cfd::AddressFactory::GetAddress((Address *)local_a80,(AddressFactory *)local_c00,&local_c80);
      cfd::core::Address::operator=(&local_558.address,(Address *)local_a80);
      cfd::core::Address::~Address((Address *)local_a80);
      this = local_bf0;
    }
    else {
      cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)local_c60);
      bVar2 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(&local_c80);
      if (bVar2) {
        cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                  ((ElementsConfidentialAddress *)local_a80,&local_c80);
        cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
                  ((Address *)local_c00,(ElementsConfidentialAddress *)local_a80);
        cfd::core::Address::operator=(&local_558.address,(Address *)local_c00);
        cfd::core::Address::~Address((Address *)local_c00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8e8._M_p != local_8d8) {
          operator_delete(local_8e8._M_p,local_8d8[0]._M_allocated_capacity + 1);
        }
        if (local_900 != (pointer)0x0) {
          operator_delete(local_900,(long)local_8f0 - (long)local_900);
        }
      }
      else {
        cfd::AddressFactory::GetAddress((Address *)local_a80,(AddressFactory *)local_c60,&local_c80)
        ;
        cfd::core::Address::operator=(&local_558.address,(Address *)local_a80);
      }
      cfd::core::Address::~Address((Address *)local_a80);
      this = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&local_c50;
    }
    this[-1]._M_allocated_capacity = (size_type)&PTR__AddressFactory_0086bad8;
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            this);
    cfd::core::Address::GetLockingScript((Script *)local_a80,&local_558.address);
    cfd::core::Script::operator=(&local_558.locking_script,(Script *)local_a80);
    cfd::core::Script::~Script((Script *)local_a80);
    _Var5._M_p = local_c80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c80._M_dataplus._M_p == &local_c80.field_2) goto LAB_004681b0;
  }
  operator_delete(_Var5._M_p,local_c80.field_2._M_allocated_capacity + 1);
LAB_004681b0:
  cfd::UtxoData::UtxoData((UtxoData *)local_a80,&local_558);
  __l._M_len = 1;
  __l._M_array = (iterator)local_a80;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)&local_c80,__l,
             (allocator_type *)local_c00);
  cfd::UtxoData::~UtxoData((UtxoData *)local_a80);
  if (local_c8a == true) {
    std::__cxx11::string::string((string *)local_c00,tx_hex,(allocator *)local_c60);
    cfd::TransactionContext::TransactionContext((TransactionContext *)local_a80,(string *)local_c00)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c00._0_8_ != local_bf0) {
      operator_delete((void *)local_c00._0_8_,local_bf0[0]._M_allocated_capacity + 1);
    }
    cfd::TransactionContext::GetTxInIndex((TransactionContext *)local_a80,&local_c38);
    cfd::TransactionContext::CollectInputUtxo
              ((TransactionContext *)local_a80,
               (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)&local_c80);
    cfd::TransactionContext::Verify((TransactionContext *)local_a80,&local_c38);
    cfd::TransactionContext::~TransactionContext((TransactionContext *)local_a80);
  }
  else {
    std::__cxx11::string::string((string *)local_c00,tx_hex,(allocator *)local_c60);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)local_a80,(string *)local_c00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c00._0_8_ != local_bf0) {
      operator_delete((void *)local_c00._0_8_,local_bf0[0]._M_allocated_capacity + 1);
    }
    bVar2 = cfd::capi::IsEmptyString(value_bytedata);
    if (!bVar2) {
      std::__cxx11::string::string((string *)local_c60,value_bytedata,&local_c89);
      cfd::core::ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)local_c00,(string *)local_c60);
      cfd::core::ConfidentialValue::operator=
                (&local_558.value_commitment,(ConfidentialValue *)local_c00);
      local_c00._0_8_ = &PTR__ConfidentialValue_0086dde8;
      if ((pointer)local_c00._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_c00._8_8_,local_bf0[0]._8_8_ - local_c00._8_8_);
      }
      if ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
          local_c60._0_8_ != &local_c50) {
        operator_delete((void *)local_c60._0_8_,
                        (ulong)((long)local_c50.
                                      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      cfd::UtxoData::operator=((UtxoData *)local_c80._M_dataplus._M_p,&local_558);
    }
    cfd::ConfidentialTransactionContext::GetTxInIndex
              ((ConfidentialTransactionContext *)local_a80,&local_c38);
    cfd::ConfidentialTransactionContext::CollectInputUtxo
              ((ConfidentialTransactionContext *)local_a80,
               (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)&local_c80);
    cfd::ConfidentialTransactionContext::Verify
              ((ConfidentialTransactionContext *)local_a80,&local_c38);
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)local_a80);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)&local_c80);
  cfd::UtxoData::~UtxoData(&local_558);
  local_c38.txid_._vptr_Txid = (_func_int **)&PTR__Txid_0086d9f8;
  if (local_c38.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c38.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c38.txid_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c38.txid_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdVerifyTxSign(
    void* handle, int net_type, const char* tx_hex, const char* txid,
    uint32_t vout, const char* address, int address_type,
    const char* direct_locking_script, int64_t value_satoshi,
    const char* value_bytedata) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    AddressType addr_type = ConvertAddressType(address_type);
    Amount amount = Amount(value_satoshi);
    OutPoint outpoint(Txid(txid), vout);

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);

    UtxoData utxo;
    utxo.address_type = AddressType::kP2shAddress;
    utxo.block_height = 0;
    utxo.binary_data = nullptr;
    utxo.descriptor = "";
    utxo.txid = outpoint.GetTxid();
    utxo.vout = outpoint.GetVout();
    utxo.address_type = addr_type;
    utxo.amount = amount;
    if (!IsEmptyString(address)) {
      std::string addr(address);
      if (is_bitcoin) {
        AddressFactory address_factory;
        utxo.address = address_factory.GetAddress(addr);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ElementsAddressFactory address_factory;
        if (ElementsConfidentialAddress::IsConfidentialAddress(addr)) {
          ElementsConfidentialAddress confidential_addr(addr);
          utxo.address = confidential_addr.GetUnblindedAddress();
        } else {
          utxo.address = address_factory.GetAddress(addr);
        }
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
      utxo.locking_script = utxo.address.GetLockingScript();
    } else if (!IsEmptyString(direct_locking_script)) {
      utxo.locking_script = Script(direct_locking_script);
    }
    std::vector<UtxoData> utxos = {utxo};

    if (is_bitcoin) {
      TransactionContext tx(tx_hex);
      tx.GetTxInIndex(outpoint);
      tx.CollectInputUtxo(utxos);
      result = CfdErrorCode::kCfdSignVerificationError;
      tx.Verify(outpoint);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex);
      if (!IsEmptyString(value_bytedata)) {
        utxo.value_commitment = ConfidentialValue(value_bytedata);
        utxos[0] = utxo;
      }
      tx.GetTxInIndex(outpoint);
      tx.CollectInputUtxo(utxos);
      result = CfdErrorCode::kCfdSignVerificationError;
      tx.Verify(outpoint);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    if (result != CfdErrorCode::kCfdSignVerificationError) {
      result = SetLastError(handle, except);
    } else {
      SetLastError(handle, except);  // collect error message
    }
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}